

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlRule.h
# Opt level: O2

string * __thiscall
GdlRuleItem::PosString_abi_cxx11_(string *__return_storage_ptr__,GdlRuleItem *this)

{
  std::__cxx11::to_string(__return_storage_ptr__,this->m_iritContextPosOrig + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string PosString()
	{
		return std::to_string(m_iritContextPosOrig + 1);
	}